

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

string * __thiscall
vkt::shaderexecutor::(anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs,
          char *inputPrefix,char *outputPrefix)

{
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  pointer pSVar4;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_298;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_290;
  const_iterator input_1;
  DeclareVariable local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  DeclareVariable local_208;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_1c8;
  __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
  local_1c0;
  const_iterator input;
  int local_1a4;
  ostringstream local_1a0 [4];
  int location;
  ostringstream src;
  char *outputPrefix_local;
  char *inputPrefix_local;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1a4 = 0;
  poVar2 = std::operator<<((ostream *)local_1a0,"#version 310 es\nlayout(location = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  std::operator<<(poVar2,") in highp vec4 a_position;\n");
  local_1c0._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 ((vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                   *)this);
  while( true ) {
    local_1c8._M_current =
         (Symbol *)
         std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::end
                   ((vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                     *)this);
    bVar1 = __gnu_cxx::operator!=(&local_1c0,&local_1c8);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)local_1a0,"layout(location = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1a4 + 1);
    poVar2 = std::operator<<(poVar2,") in ");
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_1c0);
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_1c0);
    std::operator+(&local_228,(char *)inputs,&pSVar3->name);
    glu::declare(&local_208,&pSVar4->varType,&local_228,0);
    poVar2 = glu::decl::operator<<(poVar2,&local_208);
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"layout(location = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1a4);
    poVar2 = std::operator<<(poVar2,") flat out ");
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_1c0);
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_1c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input_1,
                   inputPrefix,&pSVar3->name);
    glu::declare(&local_268,&pSVar4->varType,(string *)&input_1,0);
    poVar2 = glu::decl::operator<<(poVar2,&local_268);
    std::operator<<(poVar2,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_268);
    std::__cxx11::string::~string((string *)&input_1);
    glu::decl::DeclareVariable::~DeclareVariable(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_1c0);
    local_1a4 = local_1a4 + 1;
  }
  poVar2 = std::operator<<((ostream *)local_1a0,"\nvoid main (void)\n{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position = a_position;\n");
  std::operator<<(poVar2,"\tgl_PointSize = 1.0;\n");
  local_290._M_current =
       (Symbol *)
       std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::begin
                 ((vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                   *)this);
  while( true ) {
    local_298._M_current =
         (Symbol *)
         std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::end
                   ((vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                     *)this);
    bVar1 = __gnu_cxx::operator!=(&local_290,&local_298);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)local_1a0,"\t");
    poVar2 = std::operator<<(poVar2,inputPrefix);
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_290);
    poVar2 = std::operator<<(poVar2,(string *)pSVar4);
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::operator<<(poVar2,(char *)inputs);
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
             ::operator->(&local_290);
    poVar2 = std::operator<<(poVar2,(string *)pSVar4);
    std::operator<<(poVar2,";\n");
    __gnu_cxx::
    __normal_iterator<const_vkt::shaderexecutor::Symbol_*,_std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>_>
    ::operator++(&local_290);
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generatePassthroughVertexShader (const std::vector<Symbol>& inputs, const char* inputPrefix, const char* outputPrefix)
{

	std::ostringstream	src;
	int					location	= 0;

	src <<	"#version 310 es\n"
			"layout(location = " << location << ") in highp vec4 a_position;\n";

	for (vector<Symbol>::const_iterator input = inputs.begin(); input != inputs.end(); ++input)
	{
		location++;
		src << "layout(location = "<< location << ") in " << glu::declare(input->varType, inputPrefix + input->name) << ";\n"
			<< "layout(location = " << location - 1 << ") flat out " << glu::declare(input->varType, outputPrefix + input->name) << ";\n";
	}

	src << "\nvoid main (void)\n{\n"
		<< "	gl_Position = a_position;\n"
		<< "	gl_PointSize = 1.0;\n";

	for (vector<Symbol>::const_iterator input = inputs.begin(); input != inputs.end(); ++input)
		src << "\t" << outputPrefix << input->name << " = " << inputPrefix << input->name << ";\n";

	src << "}\n";

	return src.str();
}